

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase1098::run(TestCase1098 *this)

{
  uint i;
  long lVar1;
  Reader RVar2;
  DebugComparison<int,_unsigned_long> _kjCondition;
  OrphanBuilder local_178;
  PointerBuilder local_158;
  Orphan<capnp::Data> orphan;
  MallocMessageBuilder message;
  
  MallocMessageBuilder::MallocMessageBuilder(&message,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_158,&message.super_MessageBuilder);
  local_178.capTable = (CapTableBuilder *)local_158.pointer;
  local_178.tag.content = (uint64_t)local_158.segment;
  local_178.segment = (SegmentBuilder *)local_158.capTable;
  PointerBuilder::initStruct
            ((StructBuilder *)&_kjCondition,(PointerBuilder *)&local_178,(StructSize)0x140006);
  local_158.segment._0_4_ = _kjCondition.left;
  local_158.pointer = (WirePointer *)(_kjCondition.op.content.size_ + 8);
  local_158.capTable = (CapTableBuilder *)_kjCondition.right;
  PointerBuilder::disown(&local_178,&local_158);
  orphan.builder.capTable = local_178.capTable;
  orphan.builder.location = local_178.location;
  orphan.builder.tag.content = local_178.tag.content;
  orphan.builder.segment = local_178.segment;
  OrphanBuilder::truncate(&orphan.builder,(char *)0x3,2);
  RVar2 = OrphanBuilder::asDataReader(&orphan.builder);
  _kjCondition.right = RVar2.super_ArrayPtr<const_unsigned_char>.size_;
  _kjCondition.left = 3;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = (SegmentBuilder *)_kjCondition.right == (SegmentBuilder *)0x3;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_158.segment._0_4_ = 3;
    local_178.tag.content = _kjCondition.right;
    kj::_::Debug::
    log<char_const(&)[40],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x451,ERROR,
               "\"failed: expected \" \"(3) == (reader.size())\", _kjCondition, 3, reader.size()",
               (char (*) [40])"failed: expected (3) == (reader.size())",&_kjCondition,
               (int *)&local_158,(unsigned_long *)&local_178);
  }
  lVar1 = 0;
  do {
    _kjCondition.result = RVar2.super_ArrayPtr<const_unsigned_char>.ptr[lVar1] == '\0';
    _kjCondition.right = (unsigned_long)(RVar2.super_ArrayPtr<const_unsigned_char>.ptr + lVar1);
    _kjCondition.left = 0;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
      local_178.tag.content = local_178.tag.content & 0xffffffff00000000;
      kj::_::Debug::
      log<char_const(&)[36],kj::_::DebugComparison<int,unsigned_char_const&>&,int,unsigned_char_const&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x454,ERROR,
                 "\"failed: expected \" \"(0) == (reader[i])\", _kjCondition, 0, reader[i]",
                 (char (*) [36])"failed: expected (0) == (reader[i])",
                 (DebugComparison<int,_const_unsigned_char_&> *)&_kjCondition,(int *)&local_178,
                 (uchar *)_kjCondition.right);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (orphan.builder.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&orphan.builder);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  return;
}

Assistant:

TEST(Orphans, ExtendDataFromEmpty) {
  MallocMessageBuilder message;

  auto orphan = message.initRoot<TestAllTypes>().disownDataField();
  orphan.truncate(3);

  auto reader = orphan.getReader();
  EXPECT_EQ(3, reader.size());

  for (uint i = 0; i < 3; i++) {
    EXPECT_EQ(0, reader[i]);
  }
}